

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<BLOCK_SIZE> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<BLOCK_SIZE,_BLOCK_SIZE,_BLOCK_SIZE,_BLOCK_SIZE> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<BLOCK_SIZE> PVar1;
  vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_> *in_stack_ffffffffffffffc0;
  vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_> *in_stack_ffffffffffffffc8;
  ValueArray<BLOCK_SIZE,_BLOCK_SIZE,_BLOCK_SIZE,_BLOCK_SIZE> local_28 [10];
  
  ValueArray<BLOCK_SIZE,BLOCK_SIZE,BLOCK_SIZE,BLOCK_SIZE>::MakeVector<BLOCK_SIZE,0ul,1ul,2ul,3ul>
            (local_28,in_RSI);
  ValuesIn<std::vector<BLOCK_SIZE,std::allocator<BLOCK_SIZE>>>(in_stack_ffffffffffffffc8);
  std::vector<BLOCK_SIZE,_std::allocator<BLOCK_SIZE>_>::~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<BLOCK_SIZE>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }